

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O3

void init_opengl(void)

{
  glShadeModel(0x1d01);
  glEnable(0xb71);
  glEnableClientState(0x8074);
  glEnableClientState(0x8076);
  glVertexPointer(3,0x1406,0x18,vertex);
  glColorPointer(3,0x1406,0x18,0x1155ec);
  glPointSize(0x40000000);
  glClearColor(0,0,0,0);
  return;
}

Assistant:

void init_opengl(void)
{
    // Use Gouraud (smooth) shading
    glShadeModel(GL_SMOOTH);

    // Switch on the z-buffer
    glEnable(GL_DEPTH_TEST);

    glEnableClientState(GL_VERTEX_ARRAY);
    glEnableClientState(GL_COLOR_ARRAY);
    glVertexPointer(3, GL_FLOAT, sizeof(struct Vertex), vertex);
    glColorPointer(3, GL_FLOAT, sizeof(struct Vertex), &vertex[0].r); // Pointer to the first color

    glPointSize(2.0);

    // Background color is black
    glClearColor(0, 0, 0, 0);
}